

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsnames.c
# Opt level: O0

FT_Error FT_Get_Sfnt_LangTag(FT_Face face,FT_UInt langID,FT_SfntLangTag *alangTag)

{
  FT_Memory memory_00;
  FT_Stream stream_00;
  ushort *puVar1;
  FT_Pointer pvVar2;
  FT_Stream stream;
  FT_Memory memory;
  TT_LangTag entry;
  TT_Face_conflict ttface;
  FT_SfntLangTag *pFStack_28;
  FT_Error error;
  FT_SfntLangTag *alangTag_local;
  FT_Face pFStack_18;
  FT_UInt langID_local;
  FT_Face face_local;
  
  ttface._4_4_ = 6;
  if (((alangTag != (FT_SfntLangTag *)0x0) && (face != (FT_Face)0x0)) &&
     ((face->face_flags & 8U) != 0)) {
    if ((short)face[2].num_charmaps != 1) {
      return 8;
    }
    if ((0x8000 < langID) && (langID - 0x8000 < *(uint *)&face[2].generic.finalizer)) {
      puVar1 = (ushort *)(face[2].bbox.xMin + (ulong)(langID - 0x8000) * 0x18);
      pFStack_28 = alangTag;
      if ((*puVar1 != 0) && (*(long *)(puVar1 + 8) == 0)) {
        memory_00 = face->memory;
        stream_00 = face->stream;
        alangTag_local._4_4_ = langID;
        pFStack_18 = face;
        pvVar2 = ft_mem_realloc(memory_00,1,0,(ulong)*puVar1,(void *)0x0,
                                (FT_Error *)((long)&ttface + 4));
        *(FT_Pointer *)(puVar1 + 8) = pvVar2;
        if (((ttface._4_4_ != 0) ||
            (ttface._4_4_ = FT_Stream_Seek(stream_00,*(FT_ULong *)(puVar1 + 4)), ttface._4_4_ != 0))
           || (ttface._4_4_ = FT_Stream_Read(stream_00,*(FT_Byte **)(puVar1 + 8),(ulong)*puVar1),
              ttface._4_4_ != 0)) {
          ft_mem_free(memory_00,*(void **)(puVar1 + 8));
          puVar1[8] = 0;
          puVar1[9] = 0;
          puVar1[10] = 0;
          puVar1[0xb] = 0;
          *puVar1 = 0;
        }
      }
      pFStack_28->string = *(FT_Byte **)(puVar1 + 8);
      pFStack_28->string_len = (uint)*puVar1;
      ttface._4_4_ = 0;
    }
  }
  return ttface._4_4_;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Get_Sfnt_LangTag( FT_Face          face,
                       FT_UInt          langID,
                       FT_SfntLangTag  *alangTag )
  {
    FT_Error  error = FT_ERR( Invalid_Argument );


    if ( alangTag && face && FT_IS_SFNT( face ) )
    {
      TT_Face  ttface = (TT_Face)face;


      if ( ttface->name_table.format != 1 )
        return FT_THROW( Invalid_Table );

      if ( langID > 0x8000U                                        &&
           langID - 0x8000U < ttface->name_table.numLangTagRecords )
      {
        TT_LangTag  entry = ttface->name_table.langTags +
                            ( langID - 0x8000U );


        /* load name on demand */
        if ( entry->stringLength > 0 && !entry->string )
        {
          FT_Memory  memory = face->memory;
          FT_Stream  stream = face->stream;


          if ( FT_NEW_ARRAY  ( entry->string, entry->stringLength ) ||
               FT_STREAM_SEEK( entry->stringOffset )                ||
               FT_STREAM_READ( entry->string, entry->stringLength ) )
          {
            FT_FREE( entry->string );
            entry->stringLength = 0;
          }
        }

        alangTag->string     = (FT_Byte*)entry->string;
        alangTag->string_len = entry->stringLength;

        error = FT_Err_Ok;
      }
    }

    return error;
  }